

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O2

sc_unsigned * sc_dt::operator&(sc_unsigned *__return_storage_ptr__,sc_unsigned *u,uint64 v)

{
  sc_digit vd [3];
  
  if ((v == 0) || (u->sgn == 0)) {
    sc_length_param::sc_length_param((sc_length_param *)vd);
    sc_unsigned::sc_unsigned(__return_storage_ptr__,vd[0]);
  }
  else {
    from_uint<unsigned_long_long>(3,vd,v);
    and_unsigned_friend(__return_storage_ptr__,u->sgn,u->nbits,u->ndigits,u->digit,1,0x40,3,vd);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_unsigned
operator&(const sc_unsigned& u, uint64 v)
{

  if ((u.sgn == SC_ZERO) || (v == 0)) // case 1
    return sc_unsigned();

  CONVERT_INT64(v);

  // other cases
  return and_unsigned_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                             vs, BITS_PER_UINT64, DIGITS_PER_UINT64, vd);

}